

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O3

void __thiscall StatisticsApp::StatisticsApp(StatisticsApp *this,CommandLineOptions *options)

{
  ofstream *this_00;
  char cVar1;
  time_t tVar2;
  ostream *this_01;
  ostream *extraout_RAX;
  uint __seed;
  ostream *poVar3;
  double __x;
  stringstream msg;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  CommandLineOptions::CommandLineOptions(&this->_options,options);
  this_00 = &this->_outputFile;
  std::ofstream::ofstream((ofstream *)this_00);
  this->_outputStream = (ostream *)0x0;
  MultivariateTracker::MultivariateTracker(&this->_tracker,0,&options->statisticsOptions);
  Logger::logLevel = (Type)(this->_options).verboseLevel;
  __seed = options->seed;
  if (__seed == 0) {
    tVar2 = time((time_t *)0x0);
    __seed = (uint)tVar2;
  }
  srand(__seed);
  std::ofstream::open((ofstream *)this_00,(this->_options).fileOutput._M_dataplus._M_p,_S_out);
  poVar3 = (ostream *)this_00;
  if (((*(int *)(&this->field_0x140 + *(long *)(*(long *)this_00 + -0x18)) != 0) &&
      (poVar3 = (ostream *)&std::cout, (this->_options).fileOutput._M_string_length != 0)) &&
     (0 < (int)Logger::logLevel)) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"Output file failed to open. Writting to standard output.",0x38)
    ;
    cVar1 = std::ios::widen((ios *)((ostream *)local_198 + *(long *)(local_198[0] + -0x18)),'\n');
    this_01 = (ostream *)std::ostream::put((ostream *)local_198,cVar1);
    __x = (double)std::ostream::flush(this_01);
    Logger::log(__x);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>(extraout_RAX,(char *)local_1c8,local_1c0);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base(local_128);
    poVar3 = (ostream *)this_00;
    if (*(int *)(&this->field_0x140 + *(long *)(*(long *)this_00 + -0x18)) != 0) {
      poVar3 = (ostream *)&std::cout;
    }
  }
  this->_outputStream = poVar3;
  return;
}

Assistant:

StatisticsApp(CommandLineOptions const & options) :
        _options(options),
        _outputStream(0),
        _tracker(MultivariateTracker(0, options.statisticsOptions))
    {
        Logger::logLevel = (Logger::Level::Type)this->_options.verboseLevel;

        // ==================================================
        // Seed random number generator
        // --------------------------------------------------
        srand((options.seed == 0 ? (unsigned int)time(0) : options.seed));

        // ==================================================
        // Define output stream
        // --------------------------------------------------
        this->_outputFile.open(this->_options.fileOutput.c_str(), std::ios::out);
        if (!this->_outputFile.good() && !this->_options.fileOutput.empty())
        {
            LOG_MESSAGE(Logger::Level::ERROR, "Output file failed to open. Writting to standard output.");
        }
        this->_outputStream = (this->_outputFile.good() ? &this->_outputFile : &std::cout);
    }